

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_tv_ct(CTState *cts,CType *s,CTypeID sid,TValue *o,uint8_t *sp)

{
  uint uVar1;
  GCcdata *pGVar2;
  void *pvVar3;
  undefined2 uVar4;
  undefined4 *in_RCX;
  uint *in_RSI;
  long *in_RDI;
  int *in_R8;
  bool bVar5;
  CTSize sz;
  GCcdata *cd;
  uint32_t b;
  CTInfo sinfo;
  GCcdata *cd_1;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  GCSize size;
  lua_State *in_stack_fffffffffffffeb0;
  int local_118;
  undefined8 in_stack_ffffffffffffff18;
  uint8_t *in_stack_ffffffffffffff20;
  uint8_t *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  CType *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  
  uVar1 = *in_RSI;
  if (uVar1 >> 0x1c == 0) {
    if ((uVar1 & 0xf8000000) == 0x8000000) {
      if (in_RSI[1] == 1) {
        bVar5 = (char)*in_R8 != '\0';
      }
      else {
        bVar5 = *in_R8 != 0;
      }
      in_RCX[1] = -2 - (uint)bVar5;
      *(uint *)(in_RDI[3] + 0x124) = -2 - (uint)bVar5;
    }
    else {
      if (((uVar1 & 0xfc000000) == 0) && (4 < in_RSI[1])) goto LAB_001a590e;
      lj_cconv_ct_ct((CTState *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38,
                     (CType *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     (CTInfo)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    local_118 = 0;
  }
  else {
    if (((uVar1 & 0xfc000000) == 0x30000000) || (uVar1 >> 0x1c == 1)) {
      pGVar2 = lj_cdata_newref((CTState *)
                               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),in_RCX,
                               (CTypeID)((ulong)in_RDI[2] >> 0x20));
      *in_RCX = (int)pGVar2;
      in_RCX[1] = 0xfffffff5;
      return 1;
    }
LAB_001a590e:
    size = in_RSI[1];
    uVar4 = (undefined2)((long)in_RSI - *in_RDI >> 4);
    pvVar3 = lj_mem_newgco(in_stack_fffffffffffffeb0,size);
    *(undefined1 *)((long)pvVar3 + 5) = 10;
    *(undefined2 *)((long)pvVar3 + 6) = uVar4;
    *(long *)((ulong)*(uint *)(in_RDI[2] + 8) + 0xe0) =
         *(long *)((ulong)*(uint *)(in_RDI[2] + 8) + 0xe0) + 1;
    *in_RCX = (int)pvVar3;
    in_RCX[1] = 0xfffffff5;
    memcpy((void *)((long)pvVar3 + 8),in_R8,(ulong)size);
    local_118 = 1;
  }
  return local_118;
}

Assistant:

int lj_cconv_tv_ct(CTState *cts, CType *s, CTypeID sid,
		   TValue *o, uint8_t *sp)
{
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    if (!ctype_isbool(sinfo)) {
      if (ctype_isinteger(sinfo) && s->size > 4) goto copyval;
      if (LJ_DUALNUM && ctype_isinteger(sinfo)) {
	int32_t i;
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT32), s,
		       (uint8_t *)&i, sp, 0);
	if ((sinfo & CTF_UNSIGNED) && i < 0)
	  setnumV(o, (lua_Number)(uint32_t)i);
	else
	  setintV(o, i);
      } else {
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_DOUBLE), s,
		       (uint8_t *)&o->n, sp, 0);
	/* Numbers are NOT canonicalized here! Beware of uninitialized data. */
	lj_assertCTS(tvisnum(o), "non-canonical NaN passed");
      }
    } else {
      uint32_t b = s->size == 1 ? (*sp != 0) : (*(int *)sp != 0);
      setboolV(o, b);
      setboolV(&cts->g->tmptv2, b);  /* Remember for trace recorder. */
    }
    return 0;
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    /* Create reference. */
    setcdataV(cts->L, o, lj_cdata_newref(cts, sp, sid));
    return 1;  /* Need GC step. */
  } else {
    GCcdata *cd;
    CTSize sz;
  copyval:  /* Copy value. */
    sz = s->size;
    lj_assertCTS(sz != CTSIZE_INVALID, "value copy with invalid size");
    /* Attributes are stripped, qualifiers are kept (but mostly ignored). */
    cd = lj_cdata_new(cts, ctype_typeid(cts, s), sz);
    setcdataV(cts->L, o, cd);
    memcpy(cdataptr(cd), sp, sz);
    return 1;  /* Need GC step. */
  }
}